

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::CheckerInstanceSymbol::Connection::getOutputInitialExpr(Connection *this)

{
  CheckerInstanceBodySymbol *pCVar1;
  _Storage<const_slang::ast::Expression_*,_true> _Var2;
  LookupLocation LVar3;
  Scope *local_48;
  uint32_t local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined4 extraout_var;
  
  if ((this->outputInitialExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged == false) {
    if (this->outputInitialSyntax == (ExpressionSyntax *)0x0) {
      (this->outputInitialExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
           (Expression *)0x0;
    }
    else {
      pCVar1 = this->parent;
      LVar3 = LookupLocation::after(this->formal);
      local_40 = LVar3.index;
      local_38 = 0;
      uStack_30 = 0;
      local_28 = 0;
      uStack_20 = 0;
      local_18 = 0;
      local_48 = &pCVar1->super_Scope;
      _Var2._0_4_ = Expression::bind((int)this->outputInitialSyntax,(sockaddr *)&local_48,0);
      _Var2._4_4_ = extraout_var;
      (this->outputInitialExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload = _Var2;
    }
    (this->outputInitialExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
  }
  return (this->outputInitialExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
         _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value
  ;
}

Assistant:

const Expression* CheckerInstanceSymbol::Connection::getOutputInitialExpr() const {
    if (!outputInitialExpr) {
        if (outputInitialSyntax) {
            ASTContext context(parent, LookupLocation::after(formal));
            outputInitialExpr = &Expression::bind(*outputInitialSyntax, context);
        }
        else {
            outputInitialExpr = nullptr;
        }
    }
    return *outputInitialExpr;
}